

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O3

bool server::isPartOf(char *w1,char *w2)

{
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  
  sVar1 = strlen(w1);
  sVar4 = 0;
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      uVar3 = (uint)(w1[uVar2] == w2[sVar4]) + (int)sVar4;
      sVar4 = (size_t)uVar3;
      uVar2 = uVar2 + 1;
    } while (uVar2 < sVar1);
    sVar4 = (size_t)uVar3;
  }
  sVar1 = strlen(w2);
  return sVar1 == sVar4;
}

Assistant:

bool isPartOf(char* w1, char* w2)
    {
        int i=0;
        int j=0;
        
        for(int i; i < strlen(w1); i++)
        {
            if(w1[i] == w2[j])
            {
                j++;
            }
        }
        
        if(strlen(w2) == j)
            return true;
        else
            return false;
    }